

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
__thiscall
google::protobuf::compiler::cpp::anon_unknown_0::ClassVars
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,anon_unknown_0 *this,Descriptor *desc,Options *opts)

{
  char *pcVar1;
  bool bVar2;
  reference ppVar3;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  *extraout_RAX;
  Options *pOVar4;
  _Array_type *opts_00;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  Descriptor *extraout_RDX_03;
  Descriptor *extraout_RDX_04;
  Descriptor *extraout_RDX_05;
  Descriptor *extraout_RDX_06;
  Descriptor *extraout_RDX_07;
  Descriptor *extraout_RDX_08;
  Descriptor *extraout_RDX_09;
  Descriptor *extraout_RDX_10;
  Descriptor *extraout_RDX_11;
  Descriptor *extraout_RDX_12;
  Descriptor *extraout_RDX_13;
  Descriptor *extraout_RDX_14;
  Descriptor *extraout_RDX_15;
  Descriptor *extraout_RDX_16;
  Descriptor *extraout_RDX_17;
  Descriptor *desc_00;
  long lVar5;
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  iterator __begin3;
  allocator_type local_a69;
  Options *local_a68;
  string local_a60;
  string local_a40;
  string local_a20;
  string local_a00;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  iterator local_7e0 [3];
  undefined1 local_7b0 [112];
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_740;
  undefined1 local_6f8 [48];
  basic_string_view<char,_std::char_traits<char>_> local_6c8;
  basic_string_view<char,_std::char_traits<char>_> local_6b8;
  Sub local_6a8;
  Sub local_5f0;
  Sub local_538;
  Sub local_480;
  Sub local_3c8;
  Sub local_310;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_980,"pkg","");
  local_a68 = (Options *)desc;
  Namespace_abi_cxx11_(&local_940,(cpp *)this,desc,opts);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_6a8,&local_980,&local_940);
  local_9a0._M_dataplus._M_p = (pointer)&local_9a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a0,"Msg","");
  ClassName_abi_cxx11_(&local_800,(cpp *)this,descriptor);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_5f0,&local_9a0,&local_800);
  local_9c0._M_dataplus._M_p = (pointer)&local_9c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c0,"pkg::Msg","");
  QualifiedClassName_abi_cxx11_(&local_820,(cpp *)this,(Descriptor *)local_a68,opts);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_538,&local_9c0,&local_820);
  local_9e0._M_dataplus._M_p = (pointer)&local_9e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e0,"pkg.Msg","");
  local_6b8._M_len = (size_t)*(ushort *)(*(long *)(this + 0x10) + 2);
  pOVar4 = (Options *)(~local_6b8._M_len + *(long *)(this + 0x10));
  local_6b8._M_str = (char *)pOVar4;
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (&local_480,&local_9e0,&local_6b8);
  local_a00._M_dataplus._M_p = (pointer)&local_a00.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a00,"classname","");
  ClassName_abi_cxx11_(&local_840,(cpp *)this,descriptor_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_3c8,&local_a00,&local_840);
  local_a20._M_dataplus._M_p = (pointer)&local_a20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a20,"classtype","");
  QualifiedClassName_abi_cxx11_(&local_860,(cpp *)this,(Descriptor *)local_a68,pOVar4);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_310,&local_a20,&local_860);
  local_a40._M_dataplus._M_p = (pointer)&local_a40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a40,"full_name","");
  local_6c8._M_len = (size_t)*(ushort *)(*(long *)(this + 0x10) + 2);
  pOVar4 = (Options *)(~local_6c8._M_len + *(long *)(this + 0x10));
  local_6c8._M_str = (char *)pOVar4;
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (&local_258,&local_a40,&local_6c8);
  local_a60._M_dataplus._M_p = (pointer)&local_a60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a60,"superclass","");
  SuperClassName_abi_cxx11_(&local_880,(cpp *)this,(Descriptor *)local_a68,pOVar4);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_1a0,&local_a60,&local_880);
  local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a0,"WeakDescriptorSelfPin","");
  bVar2 = UsingImplicitWeakDescriptor(*(FileDescriptor **)(this + 0x18),local_a68);
  if (bVar2) {
    StrongReferenceToType_abi_cxx11_(&local_8c0,(cpp *)this,(Descriptor *)local_a68,pOVar4);
    local_6f8._0_8_ = (ctrl_t *)0x1;
    local_6f8._8_8_ = ";";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_960,(lts_20250127 *)local_7e0,(AlphaNum *)local_6f8,
               (AlphaNum *)local_8c0._M_string_length);
  }
  else {
    local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,anon_var_dwarf_a22956 + 5);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_7b0,&local_8a0,&local_960);
  local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e0,";","");
  io::Printer::Sub::WithSuffix(&local_e8,(Sub *)local_7b0,&local_8e0);
  __l._M_len = 9;
  __l._M_array = &local_6a8;
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  vector(__return_storage_ptr__,__l,&local_a69);
  lVar5 = 0x678;
  do {
    if (*(char *)((long)&local_6b8._M_str + lVar5) == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_6f8 + lVar5 + 8));
    }
    if ((long *)(local_6f8 + lVar5 + -0x10) != *(long **)(local_6f8 + lVar5 + -0x20)) {
      operator_delete(*(long **)(local_6f8 + lVar5 + -0x20),*(long *)(local_6f8 + lVar5 + -0x10) + 1
                     );
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)local_6f8[lVar5 + -0x28]]._M_data)
              ((anon_class_1_0_00000001 *)&local_a69,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)((long)&local_740._M_payload + lVar5));
    local_6f8[lVar5 + -0x28] = 0xff;
    if ((long *)(local_7b0 + lVar5 + 0x60) != *(long **)(local_7b0 + lVar5 + 0x50)) {
      operator_delete(*(long **)(local_7b0 + lVar5 + 0x50),*(long *)(local_7b0 + lVar5 + 0x60) + 1);
    }
    lVar5 = lVar5 + -0xb8;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
    operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
  }
  if (local_740._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_740);
  }
  if ((undefined1 *)local_7b0._72_8_ != local_7b0 + 0x58) {
    operator_delete((void *)local_7b0._72_8_,local_7b0._88_8_ + 1);
  }
  opts_00 = &std::__detail::__variant::
             __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
             ::_S_vtable;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_7b0[0x40]]._M_data)
            ((anon_class_1_0_00000001 *)&local_a69,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)(local_7b0 + 0x20));
  local_7b0[0x40] = 0xff;
  desc_00 = extraout_RDX;
  if ((undefined1 *)local_7b0._0_8_ != local_7b0 + 0x10) {
    operator_delete((void *)local_7b0._0_8_,local_7b0._16_8_ + 1);
    desc_00 = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_960._M_dataplus._M_p != &local_960.field_2) {
    operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_01;
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0._M_dataplus._M_p != &local_8c0.field_2)) {
    operator_delete(local_8c0._M_dataplus._M_p,local_8c0.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
    operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880._M_dataplus._M_p != &local_880.field_2) {
    operator_delete(local_880._M_dataplus._M_p,local_880.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_04;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._M_dataplus._M_p != &local_a60.field_2) {
    operator_delete(local_a60._M_dataplus._M_p,local_a60.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_05;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
    operator_delete(local_a40._M_dataplus._M_p,local_a40.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_06;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_07;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
    operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_08;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._M_dataplus._M_p != &local_840.field_2) {
    operator_delete(local_840._M_dataplus._M_p,local_840.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_09;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
    operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_10;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
    operator_delete(local_9e0._M_dataplus._M_p,local_9e0.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_11;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_12;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0._M_dataplus._M_p != &local_9c0.field_2) {
    operator_delete(local_9c0._M_dataplus._M_p,local_9c0.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_13;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800._M_dataplus._M_p != &local_800.field_2) {
    operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_14;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a0._M_dataplus._M_p != &local_9a0.field_2) {
    operator_delete(local_9a0._M_dataplus._M_p,local_9a0.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_15;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_940._M_dataplus._M_p != &local_940.field_2) {
    operator_delete(local_940._M_dataplus._M_p,local_940.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_16;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_980._M_dataplus._M_p != &local_980.field_2) {
    operator_delete(local_980._M_dataplus._M_p,local_980.field_2._M_allocated_capacity + 1);
    desc_00 = extraout_RDX_17;
  }
  MessageVars_abi_cxx11_
            ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_7b0,(cpp *)this,desc_00);
  local_7e0[0] = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_7b0);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_7b0);
  local_6f8._0_8_ = (ctrl_t *)0x0;
  while( true ) {
    bVar2 = absl::lts_20250127::container_internal::operator==(local_7e0,(iterator *)local_6f8);
    if (bVar2) break;
    ppVar3 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::iterator::operator*(local_7e0);
    pcVar1 = (ppVar3->first)._M_str;
    local_900._M_dataplus._M_p = (pointer)&local_900.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_900,pcVar1,pcVar1 + (ppVar3->first)._M_len);
    io::Printer::Sub::Sub<std::__cxx11::string&>(&local_6a8,&local_900,&ppVar3->second);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::emplace_back<google::protobuf::io::Printer::Sub>(__return_storage_ptr__,&local_6a8);
    if (local_6a8.annotation_.
        super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
        _M_payload.
        super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
        .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged ==
        true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 &local_6a8.annotation_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a8.value_.consume_after._M_dataplus._M_p !=
        &local_6a8.value_.consume_after.field_2) {
      operator_delete(local_6a8.value_.consume_after._M_dataplus._M_p,
                      local_6a8.value_.consume_after.field_2._M_allocated_capacity + 1);
    }
    opts_00 = &std::__detail::__variant::
               __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
               ::_S_vtable;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr
      [local_6a8.value_.value.
       super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
       .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       _M_index]._M_data)((anon_class_1_0_00000001 *)&local_940,&local_6a8.value_.value);
    local_6a8.value_.value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_index
         = 0xff;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a8.key_._M_dataplus._M_p != &local_6a8.key_.field_2) {
      operator_delete(local_6a8.key_._M_dataplus._M_p,
                      local_6a8.key_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_900._M_dataplus._M_p != &local_900.field_2) {
      operator_delete(local_900._M_dataplus._M_p,local_900.field_2._M_allocated_capacity + 1);
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::iterator::operator++(local_7e0);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_7b0);
  UnknownFieldsVars_abi_cxx11_
            ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_7b0,(cpp *)this,(Descriptor *)local_a68,(Options *)opts_00);
  local_7e0[0] = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_7b0);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_7b0);
  local_6f8._0_8_ = (ctrl_t *)0x0;
  while( true ) {
    bVar2 = absl::lts_20250127::container_internal::operator==(local_7e0,(iterator *)local_6f8);
    if (bVar2) break;
    ppVar3 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::iterator::operator*(local_7e0);
    pcVar1 = (ppVar3->first)._M_str;
    local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_920,pcVar1,pcVar1 + (ppVar3->first)._M_len);
    io::Printer::Sub::Sub<std::__cxx11::string&>(&local_6a8,&local_920,&ppVar3->second);
    std::
    vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
    ::emplace_back<google::protobuf::io::Printer::Sub>(__return_storage_ptr__,&local_6a8);
    if (local_6a8.annotation_.
        super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
        _M_payload.
        super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
        .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged ==
        true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 &local_6a8.annotation_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a8.value_.consume_after._M_dataplus._M_p !=
        &local_6a8.value_.consume_after.field_2) {
      operator_delete(local_6a8.value_.consume_after._M_dataplus._M_p,
                      local_6a8.value_.consume_after.field_2._M_allocated_capacity + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr
      [local_6a8.value_.value.
       super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
       .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
       _M_index]._M_data)((anon_class_1_0_00000001 *)&local_940,&local_6a8.value_.value);
    local_6a8.value_.value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_index
         = 0xff;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a8.key_._M_dataplus._M_p != &local_6a8.key_.field_2) {
      operator_delete(local_6a8.key_._M_dataplus._M_p,
                      local_6a8.key_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_920._M_dataplus._M_p != &local_920.field_2) {
      operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::iterator::operator++(local_7e0);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_7b0);
  return extraout_RAX;
}

Assistant:

std::vector<Sub> ClassVars(const Descriptor* desc, Options opts) {
  std::vector<Sub> vars = {
      {"pkg", Namespace(desc, opts)},
      {"Msg", ClassName(desc, false)},
      {"pkg::Msg", QualifiedClassName(desc, opts)},
      {"pkg.Msg", desc->full_name()},

      // Old-style names, to be removed once all usages are gone in this and
      // other files.
      {"classname", ClassName(desc, false)},
      {"classtype", QualifiedClassName(desc, opts)},
      {"full_name", desc->full_name()},
      {"superclass", SuperClassName(desc, opts)},

      Sub("WeakDescriptorSelfPin",
          UsingImplicitWeakDescriptor(desc->file(), opts)
              ? absl::StrCat(StrongReferenceToType(desc, opts), ";")
              : "")
          .WithSuffix(";"),
  };

  for (auto& pair : MessageVars(desc)) {
    vars.push_back({std::string(pair.first), pair.second});
  }

  for (auto& pair : UnknownFieldsVars(desc, opts)) {
    vars.push_back({std::string(pair.first), pair.second});
  }

  return vars;
}